

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
find<0ul,char_const(&)[7]>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *this,
          char (*params) [7])

{
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  StringPtr *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<kj::StringPtr> AVar3;
  unsigned_long *pos;
  StringPtr *local_50;
  char (*local_48) [7];
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos583;
  char (*params_local) [7];
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  _pos583.field_1 = in_RDX;
  pHVar1 = get<0ul,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>&>
                     ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(params[4] + 4));
  AVar3 = Vector<kj::StringPtr>::asPtr((Vector<kj::StringPtr> *)params);
  ::const((char (*) [7])_pos583.field_1);
  local_50 = AVar3.ptr;
  local_48 = (char (*) [7])AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = (StringPtr *)pHVar1;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher>::find<kj::StringPtr,char_const(&)[7]>
            ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)local_40,AVar3,local_48);
  other = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<kj::StringPtr_&>::Maybe((Maybe<kj::StringPtr_&> *)this);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    t = Vector<kj::StringPtr>::operator[]((Vector<kj::StringPtr> *)params,*puVar2);
    Maybe<kj::StringPtr_&>::Maybe((Maybe<kj::StringPtr_&> *)this,t);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<kj::StringPtr_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}